

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

bool QMetaObjectPrivate::disconnect
               (QObject *sender,int signal_index,QMetaObject *smeta,QObject *receiver,
               int method_index,void **slot,DisconnectType disconnectType)

{
  bool bVar1;
  int iVar2;
  Type pCVar3;
  char *pcVar4;
  long in_RCX;
  int in_EDX;
  uint in_ESI;
  QObject *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int sig_index;
  bool success;
  ConnectionData *scd;
  QBasicMutex *senderMutex;
  QObject *s;
  QMetaMethod smethod;
  ConnectionDataPointer connections;
  QMutexLocker<QBasicMutex> locker;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  LockPolicy in_stack_fffffffffffffe94;
  QObject *in_stack_fffffffffffffe98;
  undefined6 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  QString *in_stack_fffffffffffffea8;
  QBasicMutex *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  uint uVar5;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  int iVar6;
  undefined4 in_stack_fffffffffffffecc;
  ConnectionData *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  DisconnectType in_stack_fffffffffffffef0;
  int local_100;
  bool local_fb;
  bool local_f9;
  bool local_99;
  QMetaMethod local_98 [2];
  QMessageLogger local_40;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (QObject *)0x0) {
    local_99 = false;
  }
  else {
    signalSlotLock(in_RDI);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QBasicMutex>::QMutexLocker
              ((QMutexLocker<QBasicMutex> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (QBasicMutex *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    QObjectPrivate::get((QObject *)0x3f4630);
    pCVar3 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadRelaxed
                       ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3f4645);
    if (pCVar3 == (Type)0x0) {
      local_99 = false;
    }
    else {
      local_f9 = false;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (ConnectionData *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      iVar6 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
      if ((int)in_ESI < 0) {
        if ((in_RCX == 0) && (in_R8D < 0)) {
          QObject::d_func((QObject *)0x3f46ee);
          bVar1 = QObjectPrivate::isSignalConnected
                            ((QObjectPrivate *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                             (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x18,0));
          if (bVar1) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)
                       CONCAT17(in_stack_fffffffffffffea7,
                                CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                       (char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                       (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            (**in_RDI->_vptr_QObject)();
            pcVar4 = QMetaObject::className
                               ((QMetaObject *)
                                CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            QObject::objectName((QObject *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            local_fb = QString::isEmpty((QString *)0x3f477c);
            if (local_fb) {
              in_stack_fffffffffffffed8 = "unnamed";
            }
            else {
              QObject::objectName((QObject *)
                                  CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
              QString::toLocal8Bit(in_stack_fffffffffffffea8);
              in_stack_fffffffffffffed0 =
                   (ConnectionData *)
                   QByteArray::data((QByteArray *)
                                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
              in_stack_fffffffffffffed8 = (char *)in_stack_fffffffffffffed0;
            }
            local_fb = !local_fb;
            QMessageLogger::warning
                      (&local_40,
                       "QObject::disconnect: wildcard call disconnects from destroyed signal of %s::%s"
                       ,pcVar4,in_stack_fffffffffffffed8);
            if (local_fb) {
              QByteArray::~QByteArray((QByteArray *)0x3f4820);
              QString::~QString((QString *)0x3f4836);
            }
            QString::~QString((QString *)0x3f4843);
          }
        }
        local_100 = -1;
        while (iVar6 = local_100,
              iVar2 = QObjectPrivate::ConnectionData::signalVectorCount
                                ((ConnectionData *)
                                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)),
              iVar6 < iVar2) {
          QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::data
                    ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)0x3f492f);
          bVar1 = disconnectHelper((ConnectionData *)in_stack_fffffffffffffed8,
                                   (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                                   (QObject *)CONCAT44(iVar2,iVar6),in_stack_fffffffffffffec4,
                                   (void **)CONCAT44(in_stack_fffffffffffffebc,
                                                     in_stack_fffffffffffffeb8),
                                   in_stack_fffffffffffffeb0,in_stack_fffffffffffffef0);
          in_stack_fffffffffffffec4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec4);
          if (bVar1) {
            local_f9 = true;
          }
          local_100 = local_100 + 1;
        }
      }
      else {
        uVar5 = in_ESI;
        iVar2 = QObjectPrivate::ConnectionData::signalVectorCount
                          ((ConnectionData *)
                           CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        if ((int)uVar5 < iVar2) {
          QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::data
                    ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)0x3f49cb);
          local_f9 = disconnectHelper((ConnectionData *)in_stack_fffffffffffffed8,iVar6,
                                      (QObject *)
                                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                      in_stack_fffffffffffffec4,
                                      (void **)CONCAT44(uVar5,in_stack_fffffffffffffeb8),
                                      in_stack_fffffffffffffeb0,in_stack_fffffffffffffef0);
        }
      }
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      QMutexLocker<QBasicMutex>::unlock
                ((QMutexLocker<QBasicMutex> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      if (local_f9 != false) {
        QObjectPrivate::ConnectionData::cleanOrphanedConnections
                  ((ConnectionData *)
                   CONCAT17(in_stack_fffffffffffffea7,
                            CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                   in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
        local_98[0].mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
        local_98[0].data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
        local_98[0].mobj = (QMetaObject *)signal(in_EDX,(__sighandler_t)(ulong)in_ESI);
        bVar1 = QMetaMethod::isValid(local_98);
        if (bVar1) {
          (*in_RDI->_vptr_QObject[0xb])(in_RDI,local_98);
        }
      }
      local_99 = local_f9;
    }
    QMutexLocker<QBasicMutex>::~QMutexLocker
              ((QMutexLocker<QBasicMutex> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_99;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaObjectPrivate::disconnect(const QObject *sender,
                                    int signal_index, const QMetaObject *smeta,
                                    const QObject *receiver, int method_index, void **slot,
                                    DisconnectType disconnectType)
{
    if (!sender)
        return false;

    QObject *s = const_cast<QObject *>(sender);

    QBasicMutex *senderMutex = signalSlotLock(sender);
    QMutexLocker locker(senderMutex);

    QObjectPrivate::ConnectionData *scd = QObjectPrivate::get(s)->connections.loadRelaxed();
    if (!scd)
        return false;

    bool success = false;
    {
        // prevent incoming connections changing the connections->receivers while unlocked
        QObjectPrivate::ConnectionDataPointer connections(scd);

        if (signal_index < 0) {
            // wildcard disconnect - warn if this disconnects destroyed()
            if (!receiver && method_index < 0 && sender->d_func()->isSignalConnected(0)) {
                qWarning("QObject::disconnect: wildcard call disconnects from destroyed signal of"
                         " %s::%s", sender->metaObject()->className(),
                                    sender->objectName().isEmpty()
                                        ? "unnamed"
                                        : sender->objectName().toLocal8Bit().data());
            }
            // remove from all connection lists
            for (int sig_index = -1; sig_index < scd->signalVectorCount(); ++sig_index) {
                if (disconnectHelper(connections.data(), sig_index, receiver, method_index, slot, senderMutex, disconnectType))
                    success = true;
            }
        } else if (signal_index < scd->signalVectorCount()) {
            if (disconnectHelper(connections.data(), signal_index, receiver, method_index, slot, senderMutex, disconnectType))
                success = true;
        }
    }

    locker.unlock();
    if (success) {
        scd->cleanOrphanedConnections(s);

        QMetaMethod smethod = QMetaObjectPrivate::signal(smeta, signal_index);
        if (smethod.isValid())
            s->disconnectNotify(smethod);
    }

    return success;
}